

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

op_t * cast(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t op,MIR_type_t t,int new_op_p)

{
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op1_01;
  MIR_op_t op1_02;
  MIR_op_t op1_03;
  MIR_op_t op2;
  MIR_insn_code_t code;
  MIR_type_t local_234;
  MIR_insn_code_t local_228;
  MIR_insn_code_t local_224;
  MIR_insn_code_t local_220;
  MIR_insn_code_t local_21c;
  MIR_insn_code_t local_218;
  MIR_insn_code_t local_214;
  MIR_insn_code_t local_210;
  MIR_insn_code_t local_20c;
  MIR_insn_code_t local_208;
  MIR_insn_code_t local_204;
  MIR_insn_code_t local_200;
  MIR_insn_code_t local_1fc;
  MIR_insn_code_t local_1f8;
  MIR_insn_code_t local_1f4;
  MIR_insn_code_t local_1f0;
  MIR_insn_code_t local_1ec;
  MIR_insn_code_t local_1e8;
  MIR_insn_code_t local_1e4;
  MIR_insn_code_t local_1e0;
  MIR_insn_code_t local_1dc;
  MIR_insn_code_t local_1d8;
  MIR_insn_code_t local_1d4;
  MIR_insn_code_t local_1d0;
  MIR_insn_code_t local_1cc;
  MIR_insn_code_t local_1c8;
  MIR_insn_code_t local_1c4;
  MIR_insn_code_t local_1c0;
  MIR_insn_code_t local_1b8;
  MIR_insn_code_t local_1b4;
  MIR_insn_code_t local_1ac;
  MIR_insn_code_t local_1a8;
  MIR_insn_code_t local_1a0;
  MIR_insn_code_t local_19c;
  MIR_insn_code_t local_198;
  MIR_insn_code_t local_194;
  MIR_insn_code_t local_190;
  MIR_insn_code_t local_18c;
  MIR_insn_code_t local_188;
  MIR_insn_code_t local_184;
  MIR_insn_code_t local_180;
  MIR_insn_code_t local_17c;
  MIR_insn_code_t local_178;
  MIR_insn_code_t local_174;
  MIR_insn_code_t local_170;
  MIR_insn_code_t local_16c;
  MIR_insn_code_t local_168;
  MIR_insn_code_t local_164;
  MIR_insn_code_t local_160;
  MIR_insn_code_t local_15c;
  MIR_insn_code_t local_158;
  MIR_insn_code_t local_154;
  MIR_insn_code_t local_150;
  MIR_insn_code_t local_14c;
  op_t local_128;
  op_t local_e8;
  MIR_insn_code_t local_a4;
  MIR_insn_code_t local_a0;
  MIR_insn_code_t insn_code2;
  MIR_insn_code_t insn_code;
  MIR_type_t op_type;
  op_t interm;
  op_t res;
  int new_op_p_local;
  MIR_type_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  local_a0 = MIR_INSN_BOUND;
  local_a4 = MIR_INSN_BOUND;
  if ((((((t != MIR_T_I8) && (t != MIR_T_U8)) && (t != MIR_T_I16)) &&
       ((t != MIR_T_U16 && (t != MIR_T_I32)))) && (t != MIR_T_U32)) &&
     (((t != MIR_T_I64 && (t != MIR_T_U64)) &&
      ((t != MIR_T_F && ((t != MIR_T_D && (t != MIR_T_LD)))))))) {
    __assert_fail("t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16 || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_F || t == MIR_T_D || t == MIR_T_LD"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x292d,"op_t cast(c2m_ctx_t, op_t, MIR_type_t, int)");
  }
  switch(op.mir_op._8_1_) {
  case (BADTYPE)0x1:
    insn_code2 = reg_type(c2m_ctx,op.mir_op.u.reg);
    goto LAB_001b9404;
  default:
    break;
  case (BADTYPE)0x3:
    if (t == MIR_T_I8) {
      local_1c0 = MIR_EXT8;
    }
    else {
      if (t == MIR_T_U8) {
        local_1c4 = MIR_UEXT8;
      }
      else {
        if (t == MIR_T_I16) {
          local_1c8 = MIR_EXT16;
        }
        else {
          if (t == MIR_T_U16) {
            local_1cc = MIR_UEXT16;
          }
          else {
            if (t == MIR_T_F) {
              local_1d0 = MIR_I2F;
            }
            else {
              if (t == MIR_T_D) {
                local_1d4 = MIR_I2D;
              }
              else {
                local_1d4 = MIR_INSN_BOUND;
                if (t == MIR_T_LD) {
                  local_1d4 = MIR_I2LD;
                }
              }
              local_1d0 = local_1d4;
            }
            local_1cc = local_1d0;
          }
          local_1c8 = local_1cc;
        }
        local_1c4 = local_1c8;
      }
      local_1c0 = local_1c4;
    }
    local_a0 = local_1c0;
    break;
  case (BADTYPE)0x4:
    if (t == MIR_T_I8) {
      local_1d8 = MIR_EXT8;
    }
    else {
      if (t == MIR_T_U8) {
        local_1dc = MIR_UEXT8;
      }
      else {
        if (t == MIR_T_I16) {
          local_1e0 = MIR_EXT16;
        }
        else {
          if (t == MIR_T_U16) {
            local_1e4 = MIR_UEXT16;
          }
          else {
            if (t == MIR_T_F) {
              local_1e8 = MIR_UI2F;
            }
            else {
              if (t == MIR_T_D) {
                local_1ec = MIR_UI2D;
              }
              else {
                local_1ec = MIR_INSN_BOUND;
                if (t == MIR_T_LD) {
                  local_1ec = MIR_UI2LD;
                }
              }
              local_1e8 = local_1ec;
            }
            local_1e4 = local_1e8;
          }
          local_1e0 = local_1e4;
        }
        local_1dc = local_1e0;
      }
      local_1d8 = local_1dc;
    }
    local_a0 = local_1d8;
    break;
  case (BADTYPE)0x5:
    goto LAB_001b9c35;
  case (BADTYPE)0x6:
    goto LAB_001b9d33;
  case (BADTYPE)0x7:
    goto LAB_001b9e31;
  case (BADTYPE)0xa:
    insn_code2 = (MIR_insn_code_t)(byte)op.mir_op.u.reg._0_1_;
    if ((insn_code2 != MIR_LD2I) &&
       (((((insn_code2 == MIR_MOV || (insn_code2 == MIR_FMOV)) || (insn_code2 == MIR_DMOV)) ||
         ((insn_code2 == MIR_LDMOV || (insn_code2 == MIR_EXT8)))) || (insn_code2 == MIR_EXT16)))) {
      insn_code2 = MIR_EXT32;
    }
LAB_001b9404:
    if (insn_code2 == MIR_UEXT16) {
LAB_001b9c35:
      if ((((t == MIR_T_I8) || (t == MIR_T_U8)) || (t == MIR_T_I16)) ||
         (((t == MIR_T_U16 || (t == MIR_T_I32)) ||
          ((t == MIR_T_U32 || ((t == MIR_T_I64 || (t == MIR_T_U64)))))))) {
        local_1f0 = MIR_F2I;
      }
      else {
        if (t == MIR_T_D) {
          local_1f4 = MIR_F2D;
        }
        else {
          local_1f4 = MIR_INSN_BOUND;
          if (t == MIR_T_LD) {
            local_1f4 = MIR_F2LD;
          }
        }
        local_1f0 = local_1f4;
      }
      local_a0 = local_1f0;
      if (t == MIR_T_I8) {
        local_1f8 = MIR_EXT8;
      }
      else {
        if (t == MIR_T_U8) {
          local_1fc = MIR_UEXT8;
        }
        else {
          if (t == MIR_T_I16) {
            local_200 = MIR_EXT16;
          }
          else {
            local_200 = MIR_INSN_BOUND;
            if (t == MIR_T_U16) {
              local_200 = MIR_UEXT16;
            }
          }
          local_1fc = local_200;
        }
        local_1f8 = local_1fc;
      }
      local_a4 = local_1f8;
    }
    else if (insn_code2 == MIR_UEXT32) {
LAB_001b9d33:
      if (((((t == MIR_T_I8) || (t == MIR_T_U8)) || (t == MIR_T_I16)) ||
          ((t == MIR_T_U16 || (t == MIR_T_I32)))) ||
         ((t == MIR_T_U32 || ((t == MIR_T_I64 || (t == MIR_T_U64)))))) {
        local_204 = MIR_D2I;
      }
      else {
        if (t == MIR_T_F) {
          local_208 = MIR_D2F;
        }
        else {
          local_208 = MIR_INSN_BOUND;
          if (t == MIR_T_LD) {
            local_208 = MIR_D2LD;
          }
        }
        local_204 = local_208;
      }
      local_a0 = local_204;
      if (t == MIR_T_I8) {
        local_20c = MIR_EXT8;
      }
      else {
        if (t == MIR_T_U8) {
          local_210 = MIR_UEXT8;
        }
        else {
          if (t == MIR_T_I16) {
            local_214 = MIR_EXT16;
          }
          else {
            local_214 = MIR_INSN_BOUND;
            if (t == MIR_T_U16) {
              local_214 = MIR_UEXT16;
            }
          }
          local_210 = local_214;
        }
        local_20c = local_210;
      }
      local_a4 = local_20c;
    }
    else if (insn_code2 == MIR_I2F) {
LAB_001b9e31:
      if ((((t == MIR_T_I8) || (t == MIR_T_U8)) || (t == MIR_T_I16)) ||
         (((t == MIR_T_U16 || (t == MIR_T_I32)) ||
          ((t == MIR_T_U32 || ((t == MIR_T_I64 || (t == MIR_T_U64)))))))) {
        local_218 = MIR_LD2I;
      }
      else {
        if (t == MIR_T_F) {
          local_21c = MIR_LD2F;
        }
        else {
          local_21c = MIR_INSN_BOUND;
          if (t == MIR_T_D) {
            local_21c = MIR_LD2D;
          }
        }
        local_218 = local_21c;
      }
      local_a0 = local_218;
      if (t == MIR_T_I8) {
        local_220 = MIR_EXT8;
      }
      else {
        if (t == MIR_T_U8) {
          local_224 = MIR_UEXT8;
        }
        else {
          if (t == MIR_T_I16) {
            local_228 = MIR_EXT16;
          }
          else {
            local_228 = MIR_INSN_BOUND;
            if (t == MIR_T_U16) {
              local_228 = MIR_UEXT16;
            }
          }
          local_224 = local_228;
        }
        local_220 = local_224;
      }
      local_a4 = local_220;
    }
    else if (t == MIR_T_I64) {
      if (insn_code2 == MIR_EXT8) {
        local_14c = MIR_EXT32;
      }
      else {
        if (insn_code2 == MIR_EXT16) {
          local_150 = MIR_UEXT32;
        }
        else {
          if (insn_code2 == MIR_UEXT16) {
            local_154 = MIR_F2I;
          }
          else {
            if (insn_code2 == MIR_UEXT32) {
              local_158 = MIR_D2I;
            }
            else {
              local_158 = MIR_INSN_BOUND;
              if (insn_code2 == MIR_I2F) {
                local_158 = MIR_LD2I;
              }
            }
            local_154 = local_158;
          }
          local_150 = local_154;
        }
        local_14c = local_150;
      }
      local_a0 = local_14c;
    }
    else if (t == MIR_T_U64) {
      if (insn_code2 == MIR_EXT8) {
        local_15c = MIR_EXT32;
      }
      else {
        if (insn_code2 == MIR_EXT16) {
          local_160 = MIR_UEXT32;
        }
        else {
          if (insn_code2 == MIR_UEXT16) {
            local_164 = MIR_F2I;
          }
          else {
            if (insn_code2 == MIR_UEXT32) {
              local_168 = MIR_D2I;
            }
            else {
              local_168 = MIR_INSN_BOUND;
              if (insn_code2 == MIR_I2F) {
                local_168 = MIR_LD2I;
              }
            }
            local_164 = local_168;
          }
          local_160 = local_164;
        }
        local_15c = local_160;
      }
      local_a0 = local_15c;
    }
    else if (t == MIR_T_I32) {
      if (insn_code2 == MIR_UEXT16) {
        local_16c = MIR_F2I;
      }
      else {
        if (insn_code2 == MIR_UEXT32) {
          local_170 = MIR_D2I;
        }
        else {
          local_170 = MIR_INSN_BOUND;
          if (insn_code2 == MIR_I2F) {
            local_170 = MIR_LD2I;
          }
        }
        local_16c = local_170;
      }
      local_a0 = local_16c;
    }
    else if (t == MIR_T_U32) {
      if (insn_code2 == MIR_UEXT16) {
        local_174 = MIR_F2I;
      }
      else {
        if (insn_code2 == MIR_UEXT32) {
          local_178 = MIR_D2I;
        }
        else {
          local_178 = MIR_INSN_BOUND;
          if (insn_code2 == MIR_I2F) {
            local_178 = MIR_LD2I;
          }
        }
        local_174 = local_178;
      }
      local_a0 = local_174;
    }
    else if (t == MIR_T_I16) {
      if (insn_code2 == MIR_UEXT16) {
        local_17c = MIR_F2I;
      }
      else {
        if (insn_code2 == MIR_UEXT32) {
          local_180 = MIR_D2I;
        }
        else {
          local_180 = MIR_INSN_BOUND;
          if (insn_code2 == MIR_I2F) {
            local_180 = MIR_LD2I;
          }
        }
        local_17c = local_180;
      }
      local_a0 = local_17c;
      local_a4 = MIR_EXT16;
    }
    else if (t == MIR_T_U16) {
      if (insn_code2 == MIR_UEXT16) {
        local_184 = MIR_F2I;
      }
      else {
        if (insn_code2 == MIR_UEXT32) {
          local_188 = MIR_D2I;
        }
        else {
          local_188 = MIR_INSN_BOUND;
          if (insn_code2 == MIR_I2F) {
            local_188 = MIR_LD2I;
          }
        }
        local_184 = local_188;
      }
      local_a0 = local_184;
      local_a4 = MIR_UEXT16;
    }
    else if (t == MIR_T_I8) {
      if (insn_code2 == MIR_UEXT16) {
        local_18c = MIR_F2I;
      }
      else {
        if (insn_code2 == MIR_UEXT32) {
          local_190 = MIR_D2I;
        }
        else {
          local_190 = MIR_INSN_BOUND;
          if (insn_code2 == MIR_I2F) {
            local_190 = MIR_LD2I;
          }
        }
        local_18c = local_190;
      }
      local_a0 = local_18c;
      local_a4 = MIR_EXT8;
    }
    else if (t == MIR_T_U8) {
      if (insn_code2 == MIR_UEXT16) {
        local_194 = MIR_F2I;
      }
      else {
        if (insn_code2 == MIR_UEXT32) {
          local_198 = MIR_D2I;
        }
        else {
          local_198 = MIR_INSN_BOUND;
          if (insn_code2 == MIR_I2F) {
            local_198 = MIR_LD2I;
          }
        }
        local_194 = local_198;
      }
      local_a0 = local_194;
      local_a4 = MIR_UEXT8;
    }
    else if (t == MIR_T_F) {
      if (insn_code2 == MIR_EXT8) {
        local_19c = MIR_EXT32;
      }
      else {
        local_19c = MIR_INSN_BOUND;
        if (insn_code2 == MIR_EXT16) {
          local_19c = MIR_UEXT32;
        }
      }
      local_a0 = local_19c;
      if ((insn_code2 == MIR_EXT32) || (insn_code2 == MIR_EXT8)) {
        local_1a0 = MIR_I2F;
      }
      else {
        local_1a0 = MIR_INSN_BOUND;
        if (insn_code2 == MIR_UEXT8 || insn_code2 == MIR_EXT16) {
          local_1a0 = MIR_UI2F;
        }
      }
      local_a4 = local_1a0;
    }
    else if (t == MIR_T_D) {
      if (insn_code2 == MIR_EXT8) {
        local_1a8 = MIR_EXT32;
      }
      else {
        local_1a8 = MIR_INSN_BOUND;
        if (insn_code2 == MIR_EXT16) {
          local_1a8 = MIR_UEXT32;
        }
      }
      local_a0 = local_1a8;
      if ((insn_code2 == MIR_EXT32) || (insn_code2 == MIR_EXT8)) {
        local_1ac = MIR_I2D;
      }
      else {
        local_1ac = MIR_INSN_BOUND;
        if (insn_code2 == MIR_UEXT8 || insn_code2 == MIR_EXT16) {
          local_1ac = MIR_UI2D;
        }
      }
      local_a4 = local_1ac;
    }
    else if (t == MIR_T_LD) {
      if (insn_code2 == MIR_EXT8) {
        local_1b4 = MIR_EXT32;
      }
      else {
        local_1b4 = MIR_INSN_BOUND;
        if (insn_code2 == MIR_EXT16) {
          local_1b4 = MIR_UEXT32;
        }
      }
      local_a0 = local_1b4;
      if ((insn_code2 == MIR_EXT32) || (insn_code2 == MIR_EXT8)) {
        local_1b8 = MIR_I2LD;
      }
      else {
        local_1b8 = MIR_INSN_BOUND;
        if (insn_code2 == MIR_UEXT8 || insn_code2 == MIR_EXT16) {
          local_1b8 = MIR_UI2LD;
        }
      }
      local_a4 = local_1b8;
    }
  }
  if (((new_op_p == 0) && (local_a0 == MIR_INSN_BOUND)) && (local_a4 == MIR_INSN_BOUND)) {
    memcpy(__return_storage_ptr__,&op,0x40);
  }
  else {
    if (((t == MIR_T_I8) || (t == MIR_T_U8)) ||
       ((t == MIR_T_I16 || (local_234 = t, t == MIR_T_U16)))) {
      local_234 = MIR_T_I64;
    }
    get_new_temp(&local_e8,c2m_ctx,local_234);
    memcpy((void *)((long)&interm.mir_op.u + 0x18),&local_e8,0x40);
    if ((local_a0 == MIR_INSN_BOUND) && (local_a4 == MIR_INSN_BOUND)) {
      code = tp_mov(t);
      op1._8_8_ = res.mir_op.data;
      op1.data = (void *)res._8_8_;
      op1.u.i = res.mir_op._8_8_;
      op1.u._8_8_ = res.mir_op.u.i;
      op1.u._16_8_ = res.mir_op.u.str.s;
      op1.u.mem.disp = res.mir_op.u._16_8_;
      emit2(c2m_ctx,code,op1,op.mir_op);
    }
    else if (local_a0 == MIR_INSN_BOUND) {
      op1_00._8_8_ = res.mir_op.data;
      op1_00.data = (void *)res._8_8_;
      op1_00.u.i = res.mir_op._8_8_;
      op1_00.u._8_8_ = res.mir_op.u.i;
      op1_00.u._16_8_ = res.mir_op.u.str.s;
      op1_00.u.mem.disp = res.mir_op.u._16_8_;
      emit2(c2m_ctx,local_a4,op1_00,op.mir_op);
    }
    else if (local_a4 == MIR_INSN_BOUND) {
      op1_01._8_8_ = res.mir_op.data;
      op1_01.data = (void *)res._8_8_;
      op1_01.u.i = res.mir_op._8_8_;
      op1_01.u._8_8_ = res.mir_op.u.i;
      op1_01.u._16_8_ = res.mir_op.u.str.s;
      op1_01.u.mem.disp = res.mir_op.u._16_8_;
      emit2(c2m_ctx,local_a0,op1_01,op.mir_op);
    }
    else {
      get_new_temp(&local_128,c2m_ctx,MIR_T_I64);
      memcpy(&insn_code,&local_128,0x40);
      op1_02._8_8_ = interm.mir_op.data;
      op1_02.data = (void *)interm._8_8_;
      op1_02.u.i = interm.mir_op._8_8_;
      op1_02.u._8_8_ = interm.mir_op.u.i;
      op1_02.u._16_8_ = interm.mir_op.u.str.s;
      op1_02.u.mem.disp = interm.mir_op.u._16_8_;
      emit2(c2m_ctx,local_a0,op1_02,op.mir_op);
      op1_03._8_8_ = res.mir_op.data;
      op1_03.data = (void *)res._8_8_;
      op1_03.u.i = res.mir_op._8_8_;
      op1_03.u._8_8_ = res.mir_op.u.i;
      op1_03.u._16_8_ = res.mir_op.u.str.s;
      op1_03.u.mem.disp = res.mir_op.u._16_8_;
      op2._8_8_ = interm.mir_op.data;
      op2.data = (void *)interm._8_8_;
      op2.u.i = interm.mir_op._8_8_;
      op2.u._8_8_ = interm.mir_op.u.i;
      op2.u._16_8_ = interm.mir_op.u.str.s;
      op2.u.mem.disp = interm.mir_op.u._16_8_;
      emit2(c2m_ctx,local_a4,op1_03,op2);
    }
    memcpy(__return_storage_ptr__,(void *)((long)&interm.mir_op.u + 0x18),0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static op_t cast (c2m_ctx_t c2m_ctx, op_t op, MIR_type_t t, int new_op_p) {
  op_t res, interm;
  MIR_type_t op_type;
  MIR_insn_code_t insn_code = MIR_INSN_BOUND, insn_code2 = MIR_INSN_BOUND;

  assert (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16 || t == MIR_T_I32
          || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_F || t == MIR_T_D
          || t == MIR_T_LD);
  switch (op.mir_op.mode) {
  case MIR_OP_MEM:
    op_type = op.mir_op.u.mem.type;
    if (op_type == MIR_T_UNDEF) { /* ??? it is an array */

    } else if (op_type == MIR_T_I8 || op_type == MIR_T_U8 || op_type == MIR_T_I16
               || op_type == MIR_T_U16 || op_type == MIR_T_I32 || op_type == MIR_T_U32)
      op_type = MIR_T_I64;
    goto all_types;
  case MIR_OP_REG:
    op_type = reg_type (c2m_ctx, op.mir_op.u.reg);
  all_types:
    if (op_type == MIR_T_F) goto float_val;
    if (op_type == MIR_T_D) goto double_val;
    if (op_type == MIR_T_LD) goto ldouble_val;
    if (t == MIR_T_I64) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                   : op_type == MIR_T_F   ? MIR_F2I
                   : op_type == MIR_T_D   ? MIR_D2I
                   : op_type == MIR_T_LD  ? MIR_LD2I
                                          : MIR_INSN_BOUND);
    } else if (t == MIR_T_U64) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                   : op_type == MIR_T_F   ? MIR_F2I
                   : op_type == MIR_T_D   ? MIR_D2I
                   : op_type == MIR_T_LD  ? MIR_LD2I
                                          : MIR_INSN_BOUND);
    } else if (t == MIR_T_I32) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
    } else if (t == MIR_T_U32) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
    } else if (t == MIR_T_I16) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_EXT16;
    } else if (t == MIR_T_U16) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_UEXT16;
    } else if (t == MIR_T_I8) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_EXT8;
    } else if (t == MIR_T_U8) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_UEXT8;
    } else if (t == MIR_T_F) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2F
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2F
                                                                   : MIR_INSN_BOUND);
    } else if (t == MIR_T_D) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2D
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2D
                                                                   : MIR_INSN_BOUND);
    } else if (t == MIR_T_LD) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2LD
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2LD
                                                                   : MIR_INSN_BOUND);
    }
    break;
  case MIR_OP_INT:
    insn_code = (t == MIR_T_I8    ? MIR_EXT8
                 : t == MIR_T_U8  ? MIR_UEXT8
                 : t == MIR_T_I16 ? MIR_EXT16
                 : t == MIR_T_U16 ? MIR_UEXT16
                 : t == MIR_T_F   ? MIR_I2F
                 : t == MIR_T_D   ? MIR_I2D
                 : t == MIR_T_LD  ? MIR_I2LD
                                  : MIR_INSN_BOUND);
    break;
  case MIR_OP_UINT:
    insn_code = (t == MIR_T_I8    ? MIR_EXT8
                 : t == MIR_T_U8  ? MIR_UEXT8
                 : t == MIR_T_I16 ? MIR_EXT16
                 : t == MIR_T_U16 ? MIR_UEXT16
                 : t == MIR_T_F   ? MIR_UI2F
                 : t == MIR_T_D   ? MIR_UI2D
                 : t == MIR_T_LD  ? MIR_UI2LD
                                  : MIR_INSN_BOUND);
    break;
  case MIR_OP_FLOAT:
  float_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_F2I
                 : t == MIR_T_D  ? MIR_F2D
                 : t == MIR_T_LD ? MIR_F2LD
                                 : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  case MIR_OP_DOUBLE:
  double_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_D2I
                 : t == MIR_T_F  ? MIR_D2F
                 : t == MIR_T_LD ? MIR_D2LD
                                 : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  case MIR_OP_LDOUBLE:
  ldouble_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_LD2I
                 : t == MIR_T_F ? MIR_LD2F
                 : t == MIR_T_D ? MIR_LD2D
                                : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  default: break;
  }
  if (!new_op_p && insn_code == MIR_INSN_BOUND && insn_code2 == MIR_INSN_BOUND) return op;
  res = get_new_temp (c2m_ctx, t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                                 ? MIR_T_I64
                                 : t);
  if (insn_code == MIR_INSN_BOUND && insn_code2 == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, tp_mov (t), res.mir_op, op.mir_op);
  } else if (insn_code == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, insn_code2, res.mir_op, op.mir_op);
  } else if (insn_code2 == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, insn_code, res.mir_op, op.mir_op);
  } else {
    interm = get_new_temp (c2m_ctx, MIR_T_I64);
    emit2 (c2m_ctx, insn_code, interm.mir_op, op.mir_op);
    emit2 (c2m_ctx, insn_code2, res.mir_op, interm.mir_op);
  }
  return res;
}